

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O3

void __thiscall QJpegHandlerPrivate::~QJpegHandlerPrivate(QJpegHandlerPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  if (this->iod_src != (my_jpeg_source_mgr *)0x0) {
    jpeg_destroy_decompress(&this->info);
    operator_delete(this->iod_src,0x1048);
    this->iod_src = (my_jpeg_source_mgr *)0x0;
  }
  pDVar1 = (this->iccProfile).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->iccProfile).d.d)->super_QArrayData,1,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->readTexts).d);
  pDVar2 = (this->description).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->description).d.d)->super_QArrayData,2,0x10);
    }
  }
  QVariant::~QVariant(&this->size);
  return;
}

Assistant:

~QJpegHandlerPrivate()
    {
        if (iod_src)
        {
            jpeg_destroy_decompress(&info);
            delete iod_src;
            iod_src = nullptr;
        }
    }